

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraphPath.cc
# Opt level: O0

bool __thiscall SequenceDistanceGraphPath::is_canonical(SequenceDistanceGraphPath *this)

{
  byte bVar1;
  SequenceDistanceGraphPath rp;
  SequenceDistanceGraphPath *in_stack_00000228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  string local_78 [32];
  string local_58 [24];
  SequenceDistanceGraphPath *in_stack_ffffffffffffffc0;
  
  SequenceDistanceGraphPath
            ((SequenceDistanceGraphPath *)
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             (SequenceDistanceGraphPath *)in_stack_ffffffffffffff68);
  reverse(in_stack_ffffffffffffffc0);
  sequence_abi_cxx11_(in_stack_00000228);
  sequence_abi_cxx11_(in_stack_00000228);
  bVar1 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  ~SequenceDistanceGraphPath((SequenceDistanceGraphPath *)0x38ac6a);
  return (bool)(bVar1 & 1);
}

Assistant:

bool SequenceDistanceGraphPath::is_canonical() {
    auto rp=*this;
    rp.reverse();
    return sequence()< rp.sequence();
}